

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void process_line(void)

{
  _Bool _Var1;
  char *pcVar2;
  uint local_14;
  pattern *ppStack_10;
  uint tok_idx;
  pattern *curs;
  
  ppStack_10 = tok_ptrns;
  while( true ) {
    if (ppStack_10->emit == (parser_emit_func)0x0) {
      printf("%u tokens\n\t",(ulong)n_tokens);
      for (local_14 = 0; local_14 < n_tokens; local_14 = local_14 + 1) {
        pcVar2 = sh4asm_tok_as_str(tokens + local_14);
        printf("%s ",pcVar2);
      }
      puts("\n");
      sh4asm_error("unrecognized pattern");
    }
    _Var1 = check_pattern(ppStack_10);
    if (_Var1) break;
    ppStack_10 = ppStack_10 + 1;
  }
  (*ppStack_10->emit)();
  return;
}

Assistant:

static void process_line(void) {
    struct pattern const *curs = tok_ptrns;

    while (curs->emit) {
        if (check_pattern(curs)) {
            curs->emit();
            return;
        }
        curs++;
    }

    printf("%u tokens\n\t", n_tokens);
    unsigned tok_idx;
    for (tok_idx = 0; tok_idx < n_tokens; tok_idx++)
        printf("%s ", sh4asm_tok_as_str(tokens + tok_idx));
    puts("\n");

    sh4asm_error("unrecognized pattern");
}